

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_closebang(_glist *x)

{
  t_symbol *s_00;
  t_gotfn p_Var1;
  t_symbol *s;
  t_gobj *y;
  _glist *x_local;
  
  s_00 = gensym("loadbang");
  for (s = (t_symbol *)x->gl_list; s != (t_symbol *)0x0; s = (t_symbol *)s->s_thing) {
    if ((_class *)s->s_name != canvas_class) {
      p_Var1 = zgetfn((t_pd *)s,s_00);
      if (p_Var1 != (t_gotfn)0x0) {
        pd_vmess((t_pd *)s,s_00,"f",0x4000000000000000);
      }
    }
  }
  return;
}

Assistant:

void canvas_closebang(t_canvas *x)
{
    t_gobj *y;
    t_symbol *s = gensym("loadbang");

    /* call the closebang()-method for objects that have one
     * but NOT for subpatches/abstractions: these are called separately
     * from g_graph:glist_delete()
     */
    for (y = x->gl_list; y; y = y->g_next)
        if ((pd_class(&y->g_pd) != canvas_class) && zgetfn(&y->g_pd, s))
            pd_vmess(&y->g_pd, s, "f", (t_floatarg)LB_CLOSE);
}